

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTSerialize.h
# Opt level: O1

void __thiscall
TTD::FileWriter::WriteFormattedCharData<7ul,unsigned_int>
          (FileWriter *this,char16 (*formatString) [7],uint data)

{
  uint uVar1;
  char16_t_conflict *string;
  ulong uVar2;
  
  string = (char16_t_conflict *)ReserveSpaceForSmallData<128ul>(this);
  uVar1 = swprintf_s(string,0x40,(char16_t_conflict *)formatString,(ulong)data);
  if (0x3f < uVar1) {
    TTDAbort_unrecoverable_error("Formatting failed or result is too big.");
  }
  uVar2 = (ulong)(uVar1 * 2) + this->m_cursor;
  if (uVar2 < 0x200000) {
    this->m_cursor = uVar2;
    return;
  }
  TTDAbort_unrecoverable_error("Must have already reserved the space!");
}

Assistant:

void WriteFormattedCharData(const char16(&formatString)[N], T data)
        {
            byte* trgtBuff = this->ReserveSpaceForSmallData<TTD_SERIALIZATION_MAX_FORMATTED_DATA_SIZE>();

            int addedChars = swprintf_s((char16*)trgtBuff, (TTD_SERIALIZATION_MAX_FORMATTED_DATA_SIZE / sizeof(char16)), formatString, data);
            TTDAssert(addedChars != -1 && addedChars < (TTD_SERIALIZATION_MAX_FORMATTED_DATA_SIZE / sizeof(char16)), "Formatting failed or result is too big.");

            int addedBytes = (addedChars != -1) ? (addedChars * sizeof(char16)) : 0;
            this->CommitSpaceForSmallData(addedBytes);
        }